

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.hpp
# Opt level: O2

iterator * __thiscall
ft::multiset<int,_ft::less<int>,_ft::allocator<int>_>::insert
          (iterator *__return_storage_ptr__,multiset<int,_ft::less<int>,_ft::allocator<int>_> *this,
          iterator *position,value_type *val)

{
  size_type *psVar1;
  RBTree<int,_ft::allocator<ft::treeNode<int>_>_> *pRVar2;
  int iVar3;
  node *z;
  treeNode<int> *curr;
  treeNode<int> **pptVar4;
  undefined1 local_48 [8];
  iterator tmp;
  
  if ((this->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
      super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_size != 0) {
    pRVar2 = (RBTree<int,_ft::allocator<ft::treeNode<int>_>_> *)position->m_node;
    if (pRVar2 == (RBTree<int,_ft::allocator<ft::treeNode<int>_>_> *)
                  (this->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
                  super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_tree.m_last) {
      treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::operator--(position);
      curr = position->m_node;
      iVar3 = curr->value;
    }
    else {
      tmp.m_tree = pRVar2;
      if (*(int *)&pRVar2->NIL < *val) {
        local_48 = (undefined1  [8])&PTR__treeIterator_0010dcf0;
        tmp._vptr_treeIterator = (_func_int **)position->m_tree;
        treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::operator++
                  ((treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *)local_48);
        pptVar4 = &position->m_node;
        if ((tmp.m_tree !=
             (RBTree<int,_ft::allocator<ft::treeNode<int>_>_> *)
             (this->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
             super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_tree.m_last) &&
           (*(int *)&(tmp.m_tree)->NIL <= *val)) {
          pptVar4 = &(this->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
                     super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_tree.m_root
          ;
        }
        curr = *pptVar4;
        goto LAB_001050d3;
      }
      local_48 = (undefined1  [8])&PTR__treeIterator_0010dcf0;
      tmp._vptr_treeIterator = (_func_int **)position->m_tree;
      treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::operator--
                ((treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *)local_48);
      curr = position->m_node;
      if (curr == ((this->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
                   super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_tree.m_first)
                  ->parent) goto LAB_001050d3;
      iVar3 = *(int *)&(tmp.m_tree)->NIL;
    }
    if (iVar3 < *val) goto LAB_001050d3;
  }
  curr = (this->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
         super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_tree.m_root;
LAB_001050d3:
  z = BSTinsert(this,curr,val);
  treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>::fixInsertViolation
            ((treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_> *)this,z);
  psVar1 = &(this->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
            super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_size;
  *psVar1 = *psVar1 + 1;
  __return_storage_ptr__->_vptr_treeIterator = (_func_int **)&PTR__treeIterator_0010dcf0;
  __return_storage_ptr__->m_tree =
       &(this->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
        super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_tree;
  __return_storage_ptr__->m_node = z;
  return __return_storage_ptr__;
}

Assistant:

iterator	insert(iterator position, value_type const & val) {
		node*	ret;

		if (this->empty())
			ret = this->BSTinsert(this->root(), val);
		else if (position == this->end()) {
			--position;
			if (this->key_comp()(*position, val))
				ret = this->BSTinsert(position.node(), val);
			else
				ret = this->BSTinsert(this->root(), val);
		}
		else if (this->key_comp()(*position, val)) {
			iterator	tmp(position);
			++tmp;
			if (tmp == this->end() || this->key_comp()(val, *tmp))
				ret = this->BSTinsert(position.node(), val);
			else
				ret = this->BSTinsert(this->root(), val);
		}
		else {
			iterator	tmp(position);
			--tmp;
			if (position == this->begin() || this->key_comp()(*tmp, val))
				ret = this->BSTinsert(position.node(), val);
			else
				ret = this->BSTinsert(this->root(), val);
		}
		this->fixInsertViolation(ret);
		++this->m_size;
		return iterator(this->m_tree, ret);
	}